

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers.c
# Opt level: O0

int ffpi2b(fitsfile *fptr,long nvals,long incre,short *values,int *status)

{
  long in_RDX;
  short *in_RSI;
  int *in_R8;
  void *in_stack_00000028;
  int *in_stack_00000030;
  void *in_stack_00000038;
  LONGLONG in_stack_00000040;
  fitsfile *in_stack_00000048;
  
  ffswap2(in_RSI,in_RDX);
  if (in_RDX == 2) {
    ffpbyt(in_stack_00000048,in_stack_00000040,in_stack_00000038,in_stack_00000030);
  }
  else {
    ffpbytoff(in_stack_00000048,in_stack_00000040,(long)in_stack_00000038,(long)in_stack_00000030,
              in_stack_00000028,&fptr->HDUposition);
  }
  return *in_R8;
}

Assistant:

int ffpi2b(fitsfile *fptr, /* I - FITS file pointer                         */
           long nvals,     /* I - number of pixels in the values array      */
           long incre,     /* I - byte increment between pixels             */
           short *values,  /* I - array of values to write                  */
           int *status)    /* IO - error status                             */
/*
  put (write) the array of values to the FITS file, doing machine dependent
  format conversion (e.g. byte-swapping) if necessary.
*/
{
#if BYTESWAPPED
    ffswap2(values, nvals);  /* reverse order of bytes in each value */
#endif

    if (incre == 2)      /* write all the values at once (contiguous bytes) */

        ffpbyt(fptr, nvals * 2, values, status);

    else         /* have to write each value individually (not contiguous ) */

        ffpbytoff(fptr, 2, nvals, incre - 2, values, status);

    return(*status);
}